

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void parseDemandData(Demand *demand,Network *nw,
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *tokenList)

{
  bool bVar1;
  size_type sVar2;
  InputError *pIVar3;
  Pattern *pPVar4;
  string local_80 [35];
  undefined1 local_5d;
  string local_50 [32];
  reference local_30;
  string *tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  int nTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *nw_local;
  Demand *demand_local;
  
  pvStack_20 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)nw;
  nw_local = (Network *)demand;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  tokens._4_4_ = (int)sVar2;
  if (1 < tokens._4_4_) {
    local_30 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](pvStack_20,0);
    bVar1 = Utilities::parseNumber<double>(local_30 + 0x20,(double *)nw_local);
    if (!bVar1) {
      local_5d = 1;
      pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_50,(string *)(local_30 + 0x20));
      InputError::InputError(pIVar3,6,(string *)local_50);
      local_5d = 0;
      __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
    }
    if ((2 < tokens._4_4_) && (bVar1 = std::operator!=(local_30 + 0x40,"*"), bVar1)) {
      pPVar4 = Network::pattern((Network *)tokenList_local,local_30 + 0x40);
      (nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pPVar4;
      if ((nw_local->graph).adjLists.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_80,(string *)(local_30 + 0x40));
        InputError::InputError(pIVar3,5,(string *)local_80);
        __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
      }
    }
  }
  return;
}

Assistant:

void parseDemandData(Demand& demand, Network* nw, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - junction ID
    // 1 - base demand
    // 2 - ID of demand pattern (optional)

    int nTokens = tokenList.size();
    if ( nTokens < 2 ) return;
    string* tokens = &tokenList[0];

    // ... read base demand

    if ( !Utilities::parseNumber(tokens[1], demand.baseDemand) )
    {
        throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }

    // ... read optional demand pattern

    if ( nTokens > 2 && tokens[2] != "*" )
    {
        demand.timePattern = nw->pattern(tokens[2]);
        if ( !demand.timePattern )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[2]);
        }
    }
}